

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O2

void __thiscall amrex::MLNodeLinOp::resizeMultiGrid(MLNodeLinOp *this,int new_size)

{
  MultiFab *this_00;
  vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  *this_01;
  pointer paVar1;
  iMultiFab *piVar2;
  long lVar3;
  undefined8 uVar4;
  ulong uVar5;
  FabFactory<amrex::FArrayBox> local_1e0;
  GpuArray<amrex::LinOpBCType,_3U> local_1d8;
  GpuArray<amrex::LinOpBCType,_3U> local_1c8;
  int local_1b8;
  int local_1b4;
  undefined1 local_1b0 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avStack_1a0 [15];
  
  if ((0 < new_size) &&
     (new_size <
      *(this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start)) {
    this_01 = &((this->m_dirichlet_mask).
                super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                .
                super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
               super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
    ;
    if ((long)(ulong)(uint)new_size <
        (long)(this_01->
              super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(this_01->
              super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 3) {
      std::
      vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ::resize(this_01,(ulong)(uint)new_size);
    }
    if (this->m_masks_built == true) {
      paVar1 = (this->super_MLLinOp).m_lobc.
               super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               .
               super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1c8.arr._0_8_ = *(undefined8 *)paVar1->_M_elems;
      local_1c8.arr[2] = paVar1->_M_elems[2];
      paVar1 = (this->super_MLLinOp).m_hibc.
               super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               .
               super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1d8.arr._0_8_ = *(undefined8 *)paVar1->_M_elems;
      local_1d8.arr[2] = paVar1->_M_elems[2];
      uVar5 = (ulong)(new_size - 1U);
      if (new_size - 1U == 0) {
        piVar2 = (this->m_owner_mask_top)._M_t.
                 super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
                 super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
        local_1e0._vptr_FabFactory = local_1e0._vptr_FabFactory & 0xffffffff00000000;
        local_1b4 = 0;
        local_1b8 = *(int *)((long)&(piVar2->super_FabArray<amrex::IArrayBox>).super_FabArrayBase +
                            0xcc);
        std::make_unique<amrex::iMultiFab,amrex::iMultiFab&,amrex::MakeType,int,int>
                  ((iMultiFab *)local_1b0,(MakeType *)piVar2,(int *)&local_1e0,&local_1b4);
      }
      else {
        makeOwnerMask((MLNodeLinOp *)local_1b0,
                      (BoxArray *)
                      (uVar5 * 0x68 +
                      *(long *)&(((this->super_MLLinOp).m_grids.
                                  super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                                super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                      ),(DistributionMapping *)
                        (uVar5 * 0x10 +
                        *(long *)&(((this->super_MLLinOp).m_dmap.
                                    super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                    .
                                    super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                  ).
                                  super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        ),(Geometry *)
                          (uVar5 * 200 +
                          *(long *)&(((this->super_MLLinOp).m_geom.
                                      super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                      .
                                      super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>)
                                    .
                                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                          ));
      }
      uVar4 = local_1b0._0_8_;
      local_1b0._0_8_ = (_func_int **)0x0;
      piVar2 = (this->m_owner_mask_bottom)._M_t.
               super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
               super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
               super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
      (this->m_owner_mask_bottom)._M_t.
      super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
      super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl = (iMultiFab *)uVar4;
      if (piVar2 != (iMultiFab *)0x0) {
        (**(code **)(*(long *)&(piVar2->super_FabArray<amrex::IArrayBox>).super_FabArrayBase + 8))()
        ;
        if ((_func_int **)local_1b0._0_8_ != (_func_int **)0x0) {
          (**(code **)(*(_func_int **)local_1b0._0_8_ + 8))();
        }
      }
      piVar2 = (this->m_owner_mask_bottom)._M_t.
               super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
               super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
               super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
      lVar3 = *(long *)&(((this->super_MLLinOp).m_geom.
                          super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                        super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      MultiFab::MultiFab((MultiFab *)local_1b0);
      this_00 = &this->m_bottom_dot_mask;
      FabArray<amrex::FArrayBox>::operator=
                (&this_00->super_FabArray<amrex::FArrayBox>,(FabArray<amrex::FArrayBox> *)local_1b0)
      ;
      MultiFab::~MultiFab((MultiFab *)local_1b0);
      local_1b0._0_8_ = (iMultiFab *)0x1;
      local_1b0._8_8_ = (Arena *)0x0;
      avStack_1a0[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      avStack_1a0[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      avStack_1a0[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1e0._vptr_FabFactory = (_func_int **)&PTR__FabFactory_006d8928;
      MultiFab::define(this_00,(BoxArray *)
                               ((long)&(piVar2->super_FabArray<amrex::IArrayBox>).super_FabArrayBase
                               + 8),
                       (DistributionMapping *)
                       ((long)&(piVar2->super_FabArray<amrex::IArrayBox>).super_FabArrayBase + 0x70)
                       ,1,0,(MFInfo *)local_1b0,&local_1e0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(avStack_1a0);
      anon_unknown_1::MLNodeLinOp_set_dot_mask
                (this_00,piVar2,(Geometry *)(lVar3 + uVar5 * 200),&local_1c8,&local_1d8,
                 this->m_coarsening_strategy);
    }
    MLLinOp::resizeMultiGrid(&this->super_MLLinOp,new_size);
  }
  return;
}

Assistant:

void
MLNodeLinOp::resizeMultiGrid (int new_size)
{
    if (new_size <= 0 || new_size >= m_num_mg_levels[0]) { return; }

    if (m_dirichlet_mask[0].size() > new_size) {
        m_dirichlet_mask[0].resize(new_size);
    }

    if (m_masks_built)
    {
        const auto lobc = LoBC();
        const auto hibc = HiBC();
        int amrlev = 0;
        int mglev = new_size-1;
        if (mglev == 0) {
            m_owner_mask_bottom = std::make_unique<iMultiFab>(*m_owner_mask_top, amrex::make_alias, 0,
                                                              m_owner_mask_top->nComp());
        } else {
            m_owner_mask_bottom = makeOwnerMask(m_grids[0][mglev],
                                                 m_dmap[0][mglev],
                                                 m_geom[0][mglev]);
        }
        const Geometry& geom = m_geom[amrlev][mglev];
        const iMultiFab& omask = *m_owner_mask_bottom;
        m_bottom_dot_mask = MultiFab();
        m_bottom_dot_mask.define(omask.boxArray(), omask.DistributionMap(), 1, 0);
        MLNodeLinOp_set_dot_mask(m_bottom_dot_mask, omask, geom, lobc, hibc, m_coarsening_strategy);
    }

    MLLinOp::resizeMultiGrid(new_size);
}